

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_64bit_generated.h
# Opt level: O2

bool __thiscall WrapperTable::Verify(WrapperTable *this,Verifier *verifier)

{
  bool bVar1;
  Vector<signed_char,_unsigned_int> *vec;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>(&this->super_Table,verifier,4), bVar1)
     ) {
    vec = vector(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<signed_char,_unsigned_int>
                      (verifier,vec);
    if (bVar1) {
      verifier->depth_ = verifier->depth_ - 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset64(verifier, VT_VECTOR) &&
           verifier.VerifyVector(vector()) &&
           verifier.EndTable();
  }